

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evpath_dp.c
# Opt level: O0

void EvpathDestroyReader(CP_Services Svcs,DP_RS_Stream RS_Stream_v)

{
  void *in_RSI;
  int i;
  Evpath_RS_Stream RS_Stream;
  Evpath_RS_Stream in_stack_00000028;
  CP_Services in_stack_00000030;
  undefined4 local_1c;
  
  pthread_mutex_lock((pthread_mutex_t *)((long)in_RSI + 0x18));
  DiscardPriorPreloaded(in_stack_00000030,in_stack_00000028,(size_t)Svcs);
  pthread_mutex_unlock((pthread_mutex_t *)((long)in_RSI + 0x18));
  for (local_1c = 0; local_1c < *(int *)((long)in_RSI + 0x44); local_1c = local_1c + 1) {
    free(*(void **)(*(long *)((long)in_RSI + 0x50) + (long)local_1c * 0x10));
  }
  free(*(void **)((long)in_RSI + 0x50));
  free((void *)**(undefined8 **)((long)in_RSI + 0x68));
  free(*(void **)((long)in_RSI + 0x68));
  free(in_RSI);
  return;
}

Assistant:

static void EvpathDestroyReader(CP_Services Svcs, DP_RS_Stream RS_Stream_v)
{
    Evpath_RS_Stream RS_Stream = (Evpath_RS_Stream)RS_Stream_v;
    pthread_mutex_lock(&RS_Stream->DataLock);
    DiscardPriorPreloaded(Svcs, RS_Stream, LONG_MAX);
    pthread_mutex_unlock(&RS_Stream->DataLock);
    for (int i = 0; i < RS_Stream->WriterCohortSize; i++)
    {
        free(RS_Stream->WriterContactInfo[i].ContactString);
    }
    free(RS_Stream->WriterContactInfo);
    free(RS_Stream->MyContactInfo->ContactString);
    free(RS_Stream->MyContactInfo);
    //    printf("Total read requests %ld, from preload %ld\n",
    //           RS_Stream->TotalReadRequests,
    //           RS_Stream->ReadRequestsFromPreload);
    free(RS_Stream);
}